

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall wasm_func_t::wasm_func_t(wasm_func_t *this,RefPtr<wabt::interp::Func> *ptr)

{
  RefPtr<wabt::interp::Extern> local_28;
  
  local_28.obj_ = &ptr->obj_->super_Extern;
  local_28.store_ = ptr->store_;
  if (local_28.store_ == (Store *)0x0) {
    local_28.root_index_ = 0;
  }
  else {
    local_28.root_index_ = wabt::interp::Store::CopyRoot(local_28.store_,ptr->root_index_);
  }
  wasm_extern_t::wasm_extern_t(&this->super_wasm_extern_t,&local_28);
  if ((Func *)local_28.obj_ != (Func *)0x0) {
    wabt::interp::Store::DeleteRoot(local_28.store_,local_28.root_index_);
  }
  return;
}

Assistant:

wasm_func_t(RefPtr<Func> ptr) : wasm_extern_t(ptr) {}